

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

tuple<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* CLI::detail::get_names
            (tuple<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *input)

{
  char c;
  pointer pcVar1;
  long lVar2;
  size_type sVar3;
  long lVar4;
  _Tuple_impl<0ul,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string>
  *p_Var5;
  pointer pbVar6;
  bool bVar7;
  int iVar8;
  BadNameString *pBVar9;
  pointer pbVar10;
  pointer pbVar11;
  long lVar12;
  bool bVar13;
  string name;
  string pos_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  long_names;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  short_names;
  value_type local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  int local_138;
  undefined4 uStack_134;
  long local_130;
  long local_128 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_118;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  _Tuple_impl<0ul,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string>
  *local_e0;
  pointer local_d8;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  local_158._M_string_length = 0;
  local_158.field_2._M_local_buf[0] = '\0';
  pbVar10 = (input->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar11 = (input->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  local_e0 = (_Tuple_impl<0ul,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string>
              *)__return_storage_ptr__;
  pbVar6 = pbVar11;
  if (pbVar10 != pbVar11) {
    do {
      local_d8 = pbVar6;
      local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
      pcVar1 = (pbVar10->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_178,pcVar1,pcVar1 + pbVar10->_M_string_length);
      sVar3 = local_178._M_string_length;
      if (local_178._M_string_length != 0) {
        if (((local_178._M_string_length == 1) || (*local_178._M_dataplus._M_p != '-')) ||
           (local_178._M_dataplus._M_p[1] == '-')) {
          if (local_178._M_string_length < 3) {
            bVar13 = false;
          }
          else {
            ::std::__cxx11::string::substr((ulong)local_50,(ulong)&local_178);
            iVar8 = ::std::__cxx11::string::compare((char *)local_50);
            bVar13 = iVar8 == 0;
          }
          if ((2 < sVar3) && (local_50[0] != local_40)) {
            operator_delete(local_50[0],local_40[0] + 1);
          }
          if (bVar13) {
            ::std::__cxx11::string::substr((ulong)&local_138,(ulong)&local_178);
            ::std::__cxx11::string::operator=((string *)&local_178,(string *)&local_138);
            if ((long *)CONCAT44(uStack_134,local_138) != local_128) {
              operator_delete((long *)CONCAT44(uStack_134,local_138),local_128[0] + 1);
            }
            if ((local_178._M_string_length == 0) ||
               (bVar13 = valid_first_char<char>(*local_178._M_dataplus._M_p), !bVar13)) {
LAB_001211dd:
              pBVar9 = (BadNameString *)__cxa_allocate_exception(0x38);
              local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_90,local_178._M_dataplus._M_p,
                         local_178._M_dataplus._M_p + local_178._M_string_length);
              BadNameString::BadLongName(pBVar9,&local_90);
              __cxa_throw(pBVar9,&BadNameString::typeinfo,Error::~Error);
            }
            ::std::__cxx11::string::substr((ulong)&local_138,(ulong)&local_178);
            lVar4 = local_130;
            bVar13 = local_130 == 0;
            if (!bVar13) {
              lVar2 = CONCAT44(uStack_134,local_138);
              lVar12 = 0;
              do {
                c = *(char *)(lVar2 + lVar12);
                bVar7 = valid_first_char<char>(c);
                if (!bVar7 && 1 < (byte)(c - 0x2dU)) break;
                lVar12 = lVar12 + 1;
                bVar13 = lVar4 == lVar12;
              } while (!bVar13);
            }
            if ((long *)CONCAT44(uStack_134,local_138) != local_128) {
              operator_delete((long *)CONCAT44(uStack_134,local_138),local_128[0] + 1);
            }
            pbVar11 = local_d8;
            if (!bVar13) goto LAB_001211dd;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&local_118,&local_178);
          }
          else {
            iVar8 = ::std::__cxx11::string::compare((char *)&local_178);
            if ((iVar8 == 0) ||
               (iVar8 = ::std::__cxx11::string::compare((char *)&local_178), iVar8 == 0)) {
              pBVar9 = (BadNameString *)__cxa_allocate_exception(0x38);
              local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_b0,local_178._M_dataplus._M_p,
                         local_178._M_dataplus._M_p + local_178._M_string_length);
              BadNameString::DashesOnly(pBVar9,&local_b0);
              __cxa_throw(pBVar9,&BadNameString::typeinfo,Error::~Error);
            }
            if (local_158._M_string_length != 0) {
              pBVar9 = (BadNameString *)__cxa_allocate_exception(0x38);
              local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_d0,local_178._M_dataplus._M_p,
                         local_178._M_dataplus._M_p + local_178._M_string_length);
              BadNameString::MultiPositionalNames(pBVar9,&local_d0);
              __cxa_throw(pBVar9,&BadNameString::typeinfo,Error::~Error);
            }
            ::std::__cxx11::string::_M_assign((string *)&local_158);
          }
        }
        else {
          if ((local_178._M_string_length != 2) ||
             (bVar13 = valid_first_char<char>(local_178._M_dataplus._M_p[1]), !bVar13)) {
            pBVar9 = (BadNameString *)__cxa_allocate_exception(0x38);
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_70,local_178._M_dataplus._M_p,
                       local_178._M_dataplus._M_p + local_178._M_string_length);
            BadNameString::OneCharName(pBVar9,&local_70);
            __cxa_throw(pBVar9,&BadNameString::typeinfo,Error::~Error);
          }
          local_138 = 1;
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<int,char&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_f8,
                     &local_138,local_178._M_dataplus._M_p + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
      }
      pbVar10 = pbVar10 + 1;
      pbVar6 = local_d8;
    } while (pbVar10 != pbVar11);
  }
  p_Var5 = local_e0;
  ::std::
  _Tuple_impl<0ul,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string>
  ::
  _Tuple_impl<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&,void>
            (local_e0,&local_f8,&local_118,&local_158);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,
                    CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                             local_158.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_118);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f8);
  return (tuple<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)p_Var5;
}

Assistant:

inline std::tuple<std::vector<std::string>, std::vector<std::string>, std::string>
get_names(const std::vector<std::string> &input) {

    std::vector<std::string> short_names;
    std::vector<std::string> long_names;
    std::string pos_name;

    for(std::string name : input) {
        if(name.length() == 0) {
            continue;
        }
        if(name.length() > 1 && name[0] == '-' && name[1] != '-') {
            if(name.length() == 2 && valid_first_char(name[1]))
                short_names.emplace_back(1, name[1]);
            else
                throw BadNameString::OneCharName(name);
        } else if(name.length() > 2 && name.substr(0, 2) == "--") {
            name = name.substr(2);
            if(valid_name_string(name))
                long_names.push_back(name);
            else
                throw BadNameString::BadLongName(name);
        } else if(name == "-" || name == "--") {
            throw BadNameString::DashesOnly(name);
        } else {
            if(pos_name.length() > 0)
                throw BadNameString::MultiPositionalNames(name);
            pos_name = name;
        }
    }

    return std::tuple<std::vector<std::string>, std::vector<std::string>, std::string>(
        short_names, long_names, pos_name);
}